

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.c
# Opt level: O3

int nn_rep_send(nn_sockbase *self,nn_msg *msg)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  nn_msg *msg_00;
  nn_msg *self_00;
  
  if (((ulong)self[0x1d].sock & 1) == 0) {
    return -0x9523dfe;
  }
  msg_00 = msg;
  self_00 = msg;
  sVar4 = nn_chunkref_size(&msg->sphdr);
  if (sVar4 == 0) {
    nn_chunkref_term(&msg->sphdr);
    nn_chunkref_mv(&msg->sphdr,(nn_chunkref *)(self + 0x1e));
    *(byte *)&self[0x1d].sock = *(byte *)&self[0x1d].sock & 0xfe;
    uVar2 = nn_xrep_send(self,msg);
    self_00 = (nn_msg *)(ulong)uVar2;
    if (uVar2 == 0xfffffff5) {
      return 0;
    }
    msg_00 = msg;
    if (uVar2 == 0) {
      return 0;
    }
  }
  else {
    nn_rep_send_cold_1();
  }
  nn_rep_send_cold_2();
  if ((self_00[4].body.u.ref[0x18] & 1) != 0) goto LAB_00126a92;
  while( true ) {
    iVar3 = nn_xrep_recv((nn_sockbase *)self_00,msg_00);
    if (iVar3 == 0) {
      nn_chunkref_mv(&self_00[5].sphdr,&msg_00->sphdr);
      nn_chunkref_init(&msg_00->sphdr,0);
      pbVar1 = self_00[4].body.u.ref + 0x18;
      *pbVar1 = *pbVar1 | 1;
      return 0;
    }
    if (iVar3 == -0xb) break;
    nn_rep_recv_cold_1();
LAB_00126a92:
    nn_chunkref_term(&self_00[5].sphdr);
    pbVar1 = self_00[4].body.u.ref + 0x18;
    *pbVar1 = *pbVar1 & 0xfe;
  }
  return -0xb;
}

Assistant:

int nn_rep_send (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_rep *rep;

    rep = nn_cont (self, struct nn_rep, xrep.sockbase);

    /*  If no request was received, there's nowhere to send the reply to. */
    if (nn_slow (!(rep->flags & NN_REP_INPROGRESS)))
        return -EFSM;

    /*  Move the stored backtrace into the message header. */
    nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_mv (&msg->sphdr, &rep->backtrace);
    rep->flags &= ~NN_REP_INPROGRESS;

    /*  Send the reply. If it cannot be sent because of pushback,
        drop it silently. */
    rc = nn_xrep_send (&rep->xrep.sockbase, msg);
    errnum_assert (rc == 0 || rc == -EAGAIN, -rc);

    return 0;
}